

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

byte __thiscall nuraft::buffer::get_byte(buffer *this)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  overflow_error *this_00;
  byte *pbVar4;
  buffer *in_RDI;
  byte val;
  size_t avail;
  
  sVar2 = size(in_RDI);
  sVar3 = pos(in_RDI);
  if (sVar2 == sVar3) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer available for a byte");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar4 = data(in_RDI);
  bVar1 = *pbVar4;
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + 1;
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 1;
  }
  return bVar1;
}

Assistant:

byte buffer::get_byte() {
    size_t avail = size() - pos();
    if (avail < sz_byte) {
        throw std::overflow_error
              ( "insufficient buffer available for a byte" );
    }

    byte val = *data();
    __mv_fw_block(this, sz_byte);
    return val;
}